

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.cpp
# Opt level: O0

void __thiscall TinyGC::DetachMainThread(TinyGC *this)

{
  ostream *this_00;
  size_type sVar1;
  mapped_type *ppTVar2;
  key_type local_48 [3];
  key_type local_30;
  mapped_type local_28;
  ThreadState *ts;
  unique_lock<std::mutex> lck;
  TinyGC *this_local;
  
  lck._8_8_ = this;
  this_00 = std::operator<<((ostream *)&std::cerr,"Detach Main Thread");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&ts,&this->ts_mxt_);
  sVar1 = std::
          unordered_map<std::thread::id,_TinyGC::ThreadState_*,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>_>_>
          ::size(&this->thread_to_stack_);
  if (sVar1 == 1) {
    local_30._M_thread = (native_handle_type)std::this_thread::get_id();
    ppTVar2 = std::
              unordered_map<std::thread::id,_TinyGC::ThreadState_*,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>_>_>
              ::operator[](&this->thread_to_stack_,&local_30);
    local_28 = *ppTVar2;
    local_48[0]._M_thread = (native_handle_type)std::this_thread::get_id();
    std::
    unordered_map<std::thread::id,_TinyGC::ThreadState_*,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>_>_>
    ::erase(&this->thread_to_stack_,local_48);
    if (local_28 != (mapped_type)0x0) {
      operator_delete(local_28,0x20);
    }
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&ts);
    MarkSweepGC(this);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&ts);
    return;
  }
  __assert_fail("thread_to_stack_.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/v4kst1z[P]TinyGC/TinyGC.cpp"
                ,0x6f,"void TinyGC::DetachMainThread()");
}

Assistant:

void TinyGC::DetachMainThread() {
  LOG("Detach Main Thread");
  std::unique_lock<std::mutex> lck(ts_mxt_);
  assert(thread_to_stack_.size() == 1);
  ThreadState *ts = thread_to_stack_[std::this_thread::get_id()];
  thread_to_stack_.erase(std::this_thread::get_id());
  delete ts;
  lck.unlock();
  MarkSweepGC();
}